

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  int iVar1;
  void *pvVar2;
  int in_ESI;
  long in_RDI;
  ImSpanAllocator<3> span_allocator;
  size_t in_stack_ffffffffffffffc0;
  ImSpan<ImGuiTableColumn> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  ImSpanAllocator<3> *in_stack_ffffffffffffffe0;
  
  ImSpanAllocator<3>::ImSpanAllocator((ImSpanAllocator<3> *)0x185477);
  ImSpanAllocator<3>::Reserve
            ((ImSpanAllocator<3> *)&stack0xffffffffffffffc8,0,(long)in_ESI * 0x68,4);
  ImSpanAllocator<3>::Reserve((ImSpanAllocator<3> *)&stack0xffffffffffffffc8,1,(long)in_ESI,4);
  ImSpanAllocator<3>::Reserve((ImSpanAllocator<3> *)&stack0xffffffffffffffc8,2,(long)in_ESI << 3,4);
  ImSpanAllocator<3>::GetArenaSizeInBytes((ImSpanAllocator<3> *)&stack0xffffffffffffffc8);
  pvVar2 = MemAlloc(in_stack_ffffffffffffffc0);
  *(void **)(in_RDI + 8) = pvVar2;
  pvVar2 = *(void **)(in_RDI + 8);
  iVar1 = ImSpanAllocator<3>::GetArenaSizeInBytes((ImSpanAllocator<3> *)&stack0xffffffffffffffc8);
  memset(pvVar2,0,(long)iVar1);
  ImSpanAllocator<3>::SetArenaBasePtr
            ((ImSpanAllocator<3> *)&stack0xffffffffffffffc8,*(void **)(in_RDI + 8));
  ImSpanAllocator<3>::GetSpan<ImGuiTableColumn>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  ImSpanAllocator<3>::GetSpan<signed_char>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
             (ImSpan<signed_char> *)in_stack_ffffffffffffffd0);
  ImSpanAllocator<3>::GetSpan<ImGuiTableCellData>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
             (ImSpan<ImGuiTableCellData> *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    ImSpanAllocator<3> span_allocator;
    span_allocator.Reserve(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.Reserve(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.Reserve(2, columns_count * sizeof(ImGuiTableCellData), 4);
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
}